

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

size_type __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
::InnerMap::CopyListToTree(InnerMap *this,size_type b,Tree *tree)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this->table_[b] ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    sVar3 = 0;
  }
  else {
    sVar3 = 0;
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this->table_[b];
    do {
      local_28 = pbVar2;
      std::
      _Rb_tree<std::__cxx11::string*,std::__cxx11::string*,std::_Identity<std::__cxx11::string*>,google::protobuf::Map<std::__cxx11::string,CoreML::Specification::CustomModel_CustomModelParamValue>::InnerMap::KeyCompare,google::protobuf::Map<std::__cxx11::string,CoreML::Specification::CustomModel_CustomModelParamValue>::MapAllocator<std::__cxx11::string*>>
      ::_M_insert_unique<std::__cxx11::string*>
                ((_Rb_tree<std::__cxx11::string*,std::__cxx11::string*,std::_Identity<std::__cxx11::string*>,google::protobuf::Map<std::__cxx11::string,CoreML::Specification::CustomModel_CustomModelParamValue>::InnerMap::KeyCompare,google::protobuf::Map<std::__cxx11::string,CoreML::Specification::CustomModel_CustomModelParamValue>::MapAllocator<std::__cxx11::string*>>
                  *)tree,&local_28);
      sVar3 = sVar3 + 1;
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               pbVar2[1]._M_string_length;
      pbVar2[1]._M_string_length = 0;
      pbVar2 = pbVar1;
    } while (pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  return sVar3;
}

Assistant:

size_type CopyListToTree(size_type b, Tree* tree) {
      size_type count = 0;
      Node* node = static_cast<Node*>(table_[b]);
      while (node != NULL) {
        tree->insert(KeyPtrFromNodePtr(node));
        ++count;
        Node* next = node->next;
        node->next = NULL;
        node = next;
      }
      return count;
    }